

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Assimp::FBX::FBXConverter::ConvertMesh
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          FBXConverter *this,MeshGeometry *mesh,Model *model,aiMatrix4x4 *node_global_transform,
          aiNode *nd)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  int *piVar3;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  MatIndexArray *pMVar6;
  _Base_ptr p_Var7;
  int *piVar8;
  _Base_ptr p_Var9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> temp;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e8;
  aiNode *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [376];
  
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->meshes_converted)._M_t._M_impl.super__Rb_tree_header;
  p_Var9 = (this->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var7 = &p_Var1->_M_header;
  for (; p_Var9 != (_Base_ptr)0x0;
      p_Var9 = (&p_Var9->_M_left)[*(MeshGeometry **)(p_Var9 + 1) < mesh]) {
    if (*(MeshGeometry **)(p_Var9 + 1) >= mesh) {
      p_Var7 = p_Var9;
    }
  }
  p_Var9 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
     (p_Var9 = p_Var7, mesh < *(MeshGeometry **)(p_Var7 + 1))) {
    p_Var9 = &p_Var1->_M_header;
  }
  local_1d0 = nd;
  if ((_Rb_tree_header *)p_Var9 == p_Var1) {
    pvVar4 = MeshGeometry::GetVertices(mesh);
    pvVar5 = MeshGeometry::GetFaceIndexCounts(mesh);
    if (((pvVar4->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_start ==
         (pvVar4->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish) ||
       ((pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish)) {
      std::operator+(&local_1c8,"ignoring empty geometry: ",
                     &(mesh->super_Geometry).super_Object.name);
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
                 &local_1c8);
      LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_1a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pMVar6 = MeshGeometry::GetMaterialIndices(mesh);
      if (this->doc->settings->readMaterials == true) {
        piVar8 = (pMVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3 = (pMVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if (piVar8 != piVar3) {
          iVar2 = *piVar8;
          do {
            if (*piVar8 != iVar2) {
              ConvertMeshMultiMaterial
                        (__return_storage_ptr__,this,mesh,model,node_global_transform,local_1d0);
              goto LAB_005cb3b3;
            }
            piVar8 = piVar8 + 1;
          } while (piVar8 != piVar3);
        }
      }
      local_1a8._0_4_ = ConvertMeshSingleMaterial(this,mesh,model,node_global_transform,local_1d0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&local_1e8,(uint *)local_1a8);
    }
  }
  else {
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_int_const*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (&(p_Var9[1]._M_parent)->_M_color,&(p_Var9[1]._M_left)->_M_color,&local_1e8);
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start =
       local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_005cb3b3:
  if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned int> FBXConverter::ConvertMesh(const MeshGeometry& mesh, const Model& model,
            const aiMatrix4x4& node_global_transform, aiNode& nd)
        {
            std::vector<unsigned int> temp;

            MeshMap::const_iterator it = meshes_converted.find(&mesh);
            if (it != meshes_converted.end()) {
                std::copy((*it).second.begin(), (*it).second.end(), std::back_inserter(temp));
                return temp;
            }

            const std::vector<aiVector3D>& vertices = mesh.GetVertices();
            const std::vector<unsigned int>& faces = mesh.GetFaceIndexCounts();
            if (vertices.empty() || faces.empty()) {
                FBXImporter::LogWarn("ignoring empty geometry: " + mesh.Name());
                return temp;
            }

            // one material per mesh maps easily to aiMesh. Multiple material
            // meshes need to be split.
            const MatIndexArray& mindices = mesh.GetMaterialIndices();
            if (doc.Settings().readMaterials && !mindices.empty()) {
                const MatIndexArray::value_type base = mindices[0];
                for (MatIndexArray::value_type index : mindices) {
                    if (index != base) {
                        return ConvertMeshMultiMaterial(mesh, model, node_global_transform, nd);
                    }
                }
            }

            // faster code-path, just copy the data
            temp.push_back(ConvertMeshSingleMaterial(mesh, model, node_global_transform, nd));
            return temp;
        }